

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vli_decoder.c
# Opt level: O1

lzma_ret lzma_vli_decode(lzma_vli *vli,size_t *vli_pos,uint8_t *in,size_t *in_pos,size_t in_size)

{
  long lVar1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  lzma_vli lVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  size_t local_48;
  size_t *local_40;
  size_t vli_pos_internal;
  
  local_48 = 0;
  if (vli_pos == (size_t *)0x0) {
    *vli = 0;
    if (in_size <= *in_pos) {
      return LZMA_DATA_ERROR;
    }
    vli_pos = &local_48;
  }
  else {
    uVar5 = *vli_pos;
    if (uVar5 == 0) {
      *vli = 0;
    }
    if (8 < uVar5) {
      return LZMA_PROG_ERROR;
    }
    if (*vli >> ((char)uVar5 * '\a' & 0x3fU) != 0) {
      return LZMA_PROG_ERROR;
    }
    if (in_size <= *in_pos) {
      return LZMA_BUF_ERROR;
    }
  }
  local_40 = in_pos;
  sVar3 = *in_pos;
  sVar4 = *vli_pos;
  lVar8 = *vli;
  uVar5 = sVar3 + 1;
  if (sVar3 + 1 < in_size) {
    uVar5 = in_size;
  }
  lVar7 = sVar4 * 7;
  lVar10 = 0;
  uVar6 = uVar5;
  while( true ) {
    bVar2 = in[lVar10 + sVar3];
    uVar9 = sVar4 + lVar10 + 1;
    if ((char)bVar2 < '\0') {
      bVar11 = sVar4 + lVar10 != 8;
      uVar6 = uVar6 & 0xffffffff;
      if (!bVar11) {
        uVar6 = 9;
      }
    }
    else {
      uVar6 = (ulong)(vli_pos != &local_48);
      if (1 < uVar9) {
        uVar6 = 9;
      }
      if (bVar2 != 0) {
        uVar6 = (ulong)(vli_pos != &local_48);
      }
      bVar11 = false;
    }
    lVar8 = lVar8 + ((ulong)(bVar2 & 0x7f) << ((byte)lVar7 & 0x3f));
    if (!bVar11) break;
    lVar7 = lVar7 + 7;
    lVar1 = sVar3 + lVar10;
    lVar10 = lVar10 + 1;
    if (in_size <= lVar1 + 1U) {
      *in_pos = uVar5;
      *vli_pos = sVar4 + lVar10;
      *vli = lVar8;
      return (uint)(vli_pos == &local_48) * 9;
    }
  }
  *in_pos = sVar3 + lVar10 + 1;
  *vli_pos = uVar9;
  *vli = lVar8;
  return (lzma_ret)uVar6;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_vli_decode(lzma_vli *restrict vli, size_t *vli_pos,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size)
{
	// If we haven't been given vli_pos, work in single-call mode.
	size_t vli_pos_internal = 0;
	if (vli_pos == NULL) {
		vli_pos = &vli_pos_internal;
		*vli = 0;

		// If there's no input, use LZMA_DATA_ERROR. This way it is
		// easy to decode VLIs from buffers that have known size,
		// and get the correct error code in case the buffer is
		// too short.
		if (*in_pos >= in_size)
			return LZMA_DATA_ERROR;

	} else {
		// Initialize *vli when starting to decode a new integer.
		if (*vli_pos == 0)
			*vli = 0;

		// Validate the arguments.
		if (*vli_pos >= LZMA_VLI_BYTES_MAX
				|| (*vli >> (*vli_pos * 7)) != 0)
			return LZMA_PROG_ERROR;;

		if (*in_pos >= in_size)
			return LZMA_BUF_ERROR;
	}

	do {
		// Read the next byte. Use a temporary variable so that we
		// can update *in_pos immediately.
		const uint8_t byte = in[*in_pos];
		++*in_pos;

		// Add the newly read byte to *vli.
		*vli += (lzma_vli)(byte & 0x7F) << (*vli_pos * 7);
		++*vli_pos;

		// Check if this is the last byte of a multibyte integer.
		if ((byte & 0x80) == 0) {
			// We don't allow using variable-length integers as
			// padding i.e. the encoding must use the most the
			// compact form.
			if (byte == 0x00 && *vli_pos > 1)
				return LZMA_DATA_ERROR;

			return vli_pos == &vli_pos_internal
					? LZMA_OK : LZMA_STREAM_END;
		}

		// There is at least one more byte coming. If we have already
		// read maximum number of bytes, the integer is considered
		// corrupt.
		//
		// If we need bigger integers in future, old versions liblzma
		// will confusingly indicate the file being corrupt istead of
		// unsupported. I suppose it's still better this way, because
		// in the foreseeable future (writing this in 2008) the only
		// reason why files would appear having over 63-bit integers
		// is that the files are simply corrupt.
		if (*vli_pos == LZMA_VLI_BYTES_MAX)
			return LZMA_DATA_ERROR;

	} while (*in_pos < in_size);

	return vli_pos == &vli_pos_internal ? LZMA_DATA_ERROR : LZMA_OK;
}